

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O3

void InitAutomate(char *autotab,uchar *def)

{
  byte bVar1;
  byte *pbVar2;
  
  memset(autotab,0,0x100);
  bVar1 = *def;
  if (bVar1 != 0) {
    pbVar2 = def + 1;
    do {
      autotab[bVar1] = '\x01';
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return;
}

Assistant:

void InitAutomate(char *autotab, const unsigned char *def)
{
	#undef FUNC
	#define FUNC "InitAutomate"

	int i;

	memset(autotab,0,256);
	for (i=0;def[i];i++) {
		autotab[(int)def[i]]=1;
	}
}